

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetSourceFiles
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *config)

{
  pointer *ppp_Var1;
  size_type *psVar2;
  cmMakefile *this_00;
  cmTarget *pcVar3;
  pointer pp_Var4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  cmGeneratorExpressionDAGChecker *__x;
  string *entry;
  const_iterator cVar11;
  _Alloc_hider _Var12;
  cmStringRange cVar13;
  allocator_type local_191;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *local_190;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkInterfaceSourcesEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  uniqueSrcs;
  const_iterator local_120;
  string local_118;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  local_190 = (hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *)files;
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmState::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x445,
                  "void cmGeneratorTarget::GetSourceFiles(std::vector<std::string> &, const std::string &) const"
                 );
  }
  if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
    cVar13 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
    if (cVar13.Begin._M_current._M_current != cVar13.End._M_current._M_current) {
      do {
        local_120 = cVar13.End._M_current;
        dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)0x0;
        dagChecker.Target._M_dataplus._M_p = (pointer)0x0;
        dagChecker.Target._M_string_length = 0;
        cmSystemTools::ExpandListArgument
                  (cVar13.Begin._M_current._M_current,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&dagChecker,false);
        _Var12 = dagChecker.Target._M_dataplus;
        for (__x = dagChecker.Parent; __x != (cmGeneratorExpressionDAGChecker *)_Var12._M_p;
            __x = (cmGeneratorExpressionDAGChecker *)((__x->Target).field_2._M_local_buf + 8)) {
          pcVar9 = ((_Alloc_hider *)&__x->Parent)->_M_p;
          iVar8 = strncmp(pcVar9,"$<TARGET_OBJECTS:",0x11);
          if ((iVar8 != 0) || (pcVar9[(long)((__x->Target)._M_dataplus._M_p + -1)] != '>')) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_190,(value_type *)__x);
            _Var12 = dagChecker.Target._M_dataplus;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dagChecker);
        cVar11._M_current = cVar13.Begin._M_current._M_current + 1;
        cVar13.End._M_current = local_120._M_current;
        cVar13.Begin._M_current = cVar11._M_current;
      } while (cVar11._M_current != local_120._M_current);
    }
  }
  else {
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = this->Makefile;
    psVar2 = &dagChecker.Target._M_string_length;
    dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)psVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&dagChecker,"CMAKE_DEBUG_TARGET_PROPERTIES","");
    pcVar9 = cmMakefile::GetDefinition(this_00,(string *)&dagChecker);
    if (dagChecker.Parent != (cmGeneratorExpressionDAGChecker *)psVar2) {
      operator_delete(dagChecker.Parent,dagChecker.Target._M_string_length + 1);
    }
    if (pcVar9 != (char *)0x0) {
      dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)psVar2;
      sVar10 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)&dagChecker,pcVar9,pcVar9 + sVar10);
      cmSystemTools::ExpandListArgument((string *)&dagChecker,&debugProperties,false);
      if (dagChecker.Parent != (cmGeneratorExpressionDAGChecker *)psVar2) {
        operator_delete(dagChecker.Parent,dagChecker.Target._M_string_length + 1);
      }
    }
    if (this->DebugSourcesDone == false) {
      std::
      __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                (debugProperties.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 debugProperties.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,"SOURCES");
    }
    if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
      this->DebugSourcesDone = true;
    }
    pcVar3 = this->Target;
    ppp_Var1 = &uniqueSrcs._M_ht._M_buckets.
                super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    uniqueSrcs._M_ht._0_8_ = ppp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&uniqueSrcs,"SOURCES","");
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,&pcVar3->Name,(string *)&uniqueSrcs,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    if ((pointer *)uniqueSrcs._M_ht._0_8_ != ppp_Var1) {
      operator_delete((void *)uniqueSrcs._M_ht._0_8_,
                      (long)uniqueSrcs._M_ht._M_buckets.
                            super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 1);
    }
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::hashtable(&uniqueSrcs._M_ht,100,
                (hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_118,
                (equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&linkInterfaceSourcesEntries,&local_191);
    bVar6 = processSources(this,(vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                                 *)(this->SourceEntries).
                                   super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(this->SourceEntries).
                              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,local_190,
                           (cmGeneratorExpressionDAGChecker *)&uniqueSrcs,(string *)&dagChecker,
                           SUB81(config,0));
    linkInterfaceSourcesEntries.
    super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkInterfaceSourcesEntries.
    super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    linkInterfaceSourcesEntries.
    super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"INTERFACE_SOURCES","");
    AddInterfaceEntries(this,config,&local_118,&linkInterfaceSourcesEntries);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._0_8_ + 1);
    }
    pp_Var4 = (local_190->_M_ht)._M_buckets.
              super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = *(long *)&local_190->_M_ht;
    bVar7 = processSources(this,(vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                                 *)linkInterfaceSourcesEntries.
                                   super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)linkInterfaceSourcesEntries.
                              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,local_190,
                           (cmGeneratorExpressionDAGChecker *)&uniqueSrcs,(string *)&dagChecker,
                           SUB81(config,0));
    if ((!bVar6) &&
       ((!bVar7 ||
        ((ulong)((long)(local_190->_M_ht)._M_buckets.
                       super__Vector_base<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::allocator<cmsys::_Hashtable_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_start - *(long *)&local_190->_M_ht) <=
         (ulong)((long)pp_Var4 - lVar5))))) {
      this->LinkImplementationLanguageIsContextDependent = false;
    }
    std::
    for_each<__gnu_cxx::__normal_iterator<cmGeneratorTarget::TargetPropertyEntry*const*,std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>,false>>
              (linkInterfaceSourcesEntries.
               super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               linkInterfaceSourcesEntries.
               super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if (linkInterfaceSourcesEntries.
        super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(linkInterfaceSourcesEntries.
                      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)linkInterfaceSourcesEntries.
                            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)linkInterfaceSourcesEntries.
                            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    cmsys::
    hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::~hashtable(&uniqueSrcs._M_ht);
    cmListFileBacktrace::~cmListFileBacktrace(&dagChecker.Backtrace);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&dagChecker.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
      operator_delete(dagChecker.Property._M_dataplus._M_p,
                      dagChecker.Property.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Target._M_dataplus._M_p != &dagChecker.Target.field_2) {
      operator_delete(dagChecker.Target._M_dataplus._M_p,
                      dagChecker.Target.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&debugProperties);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetSourceFiles(std::vector<std::string> &files,
                              const std::string& config) const
{
  assert(this->GetType() != cmState::INTERFACE_LIBRARY);

  if (!this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026())
    {
    // At configure-time, this method can be called as part of getting the
    // LOCATION property or to export() a file to be include()d.  However
    // there is no cmGeneratorTarget at configure-time, so search the SOURCES
    // for TARGET_OBJECTS instead for backwards compatibility with OLD
    // behavior of CMP0024 and CMP0026 only.

    cmStringRange sourceEntries = this->Target->GetSourceEntries();
    for(cmStringRange::const_iterator
          i = sourceEntries.begin();
        i != sourceEntries.end(); ++i)
      {
      std::string const& entry = *i;

      std::vector<std::string> items;
      cmSystemTools::ExpandListArgument(entry, items);
      for (std::vector<std::string>::const_iterator
          li = items.begin(); li != items.end(); ++li)
        {
        if(cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
            (*li)[li->size() - 1] == '>')
          {
          continue;
          }
        files.push_back(*li);
        }
      }
    return;
    }

  std::vector<std::string> debugProperties;
  const char *debugProp =
              this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp)
    {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
    }

  bool debugSources = !this->DebugSourcesDone
                    && std::find(debugProperties.begin(),
                                 debugProperties.end(),
                                 "SOURCES")
                        != debugProperties.end();

  if (this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026())
    {
    this->DebugSourcesDone = true;
    }

  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(),
                                             "SOURCES", 0, 0);

  UNORDERED_SET<std::string> uniqueSrcs;
  bool contextDependentDirectSources = processSources(this,
                 this->SourceEntries,
                 files,
                 uniqueSrcs,
                 &dagChecker,
                 config,
                 debugSources);

  std::vector<cmGeneratorTarget::TargetPropertyEntry*>
    linkInterfaceSourcesEntries;

  AddInterfaceEntries(
    this, config, "INTERFACE_SOURCES",
    linkInterfaceSourcesEntries);

  std::vector<std::string>::size_type numFilesBefore = files.size();
  bool contextDependentInterfaceSources = processSources(this,
    linkInterfaceSourcesEntries,
                            files,
                            uniqueSrcs,
                            &dagChecker,
                            config,
                            debugSources);

  if (!contextDependentDirectSources
      && !(contextDependentInterfaceSources && numFilesBefore < files.size()))
    {
    this->LinkImplementationLanguageIsContextDependent = false;
    }

  cmDeleteAll(linkInterfaceSourcesEntries);
}